

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::retrieve_clusters
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint max_clusters,
          vector<crnlib::vector<unsigned_int>_> *clusters)

{
  uint uVar1;
  void *pvVar2;
  vq_node *pvVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  vector<unsigned_int> *pvVar7;
  uint uVar8;
  long lVar9;
  vector<unsigned_int> stack;
  vector<unsigned_int> local_68;
  uint local_4c;
  vector<crnlib::vector<unsigned_int>_> *local_48;
  clusterizer<crnlib::vec<2U,_float>_> *local_40;
  ulong local_38;
  
  uVar5 = clusters->m_size;
  local_4c = max_clusters;
  local_40 = this;
  if ((ulong)uVar5 != 0) {
    pvVar7 = clusters->m_p;
    lVar9 = 0;
    do {
      pvVar2 = *(void **)((long)&pvVar7->m_p + lVar9);
      if (pvVar2 != (void *)0x0) {
        crnlib_free(pvVar2);
      }
      lVar9 = lVar9 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar9);
    clusters->m_size = 0;
  }
  vector<crnlib::vector<unsigned_int>_>::reserve(clusters,local_4c);
  local_68.m_p = (uint *)0x0;
  local_68.m_size = 0;
  local_68.m_capacity = 0;
  vector<unsigned_int>::reserve(&local_68,0x200);
  uVar6 = 0;
  local_48 = clusters;
  do {
    pvVar3 = (local_40->m_nodes).m_p;
    uVar5 = pvVar3[uVar6].m_left;
    local_38 = uVar6;
    if (((int)uVar5 < 0) || ((int)local_4c < pvVar3[uVar6].m_codebook_index + 2)) {
      uVar5 = clusters->m_size;
      uVar8 = uVar5 + 1;
      if (uVar8 == 0) {
        pvVar7 = clusters->m_p;
        lVar9 = 0;
        do {
          pvVar2 = *(void **)((long)&pvVar7->m_p + lVar9);
          if (pvVar2 != (void *)0x0) {
            crnlib_free(pvVar2);
          }
          lVar9 = lVar9 + 0x10;
        } while (lVar9 != 0xffffffff0);
      }
      else {
        if (clusters->m_capacity < uVar8) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)clusters,uVar8,true,0x10,(object_mover)0x0,false);
        }
        uVar1 = clusters->m_size;
        if (uVar8 != uVar1) {
          memset(local_48->m_p + uVar1,0,(ulong)(uVar8 - uVar1) << 4);
        }
      }
      clusters = local_48;
      local_48->m_size = uVar8;
      pvVar7 = local_48->m_p + uVar5;
      if (pvVar7 != &pvVar3[uVar6].m_vectors) {
        if (pvVar7->m_capacity < pvVar3[uVar6].m_vectors.m_size) {
          if (pvVar7->m_p != (uint *)0x0) {
            crnlib_free(pvVar7->m_p);
            pvVar7->m_p = (uint *)0x0;
            pvVar7->m_size = 0;
            pvVar7->m_capacity = 0;
          }
          elemental_vector::increase_capacity
                    ((elemental_vector *)pvVar7,pvVar3[uVar6].m_vectors.m_size,false,4,
                     (object_mover)0x0,false);
        }
        else if (pvVar7->m_size != 0) {
          pvVar7->m_size = 0;
        }
        memcpy(pvVar7->m_p,pvVar3[uVar6].m_vectors.m_p,(ulong)pvVar3[uVar6].m_vectors.m_size << 2);
        pvVar7->m_size = pvVar3[uVar6].m_vectors.m_size;
      }
      if (local_68.m_size != 0) {
        uVar5 = local_68.m_p[local_68.m_size - 1];
        local_68.m_size = local_68.m_size - 1;
        goto LAB_00142884;
      }
      bVar4 = true;
      uVar5 = (uint)local_38;
    }
    else {
      uVar8 = pvVar3[uVar6].m_right;
      if (local_68.m_capacity <= local_68.m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_68,local_68.m_size + 1,true,4,(object_mover)0x0,false)
        ;
      }
      local_68.m_p[local_68._8_8_ & 0xffffffff] = uVar8;
      local_68.m_size = local_68.m_size + 1;
LAB_00142884:
      bVar4 = false;
    }
    uVar6 = (ulong)uVar5;
    if (bVar4) {
      if (local_68.m_p != (uint *)0x0) {
        crnlib_free(local_68.m_p);
      }
      return;
    }
  } while( true );
}

Assistant:

void retrieve_clusters(uint max_clusters, crnlib::vector<crnlib::vector<uint>>& clusters) const
        {
            clusters.resize(0);
            clusters.reserve(max_clusters);

            crnlib::vector<uint> stack;
            stack.reserve(512);

            uint cur_node_index = 0;

            for (;;)
            {
                const vq_node& cur_node = m_nodes[cur_node_index];

                if ((cur_node.is_leaf()) || ((cur_node.m_codebook_index + 2) > (int)max_clusters))
                {
                    clusters.resize(clusters.size() + 1);
                    clusters.back() = cur_node.m_vectors;

                    if (stack.empty())
                    {
                        break;
                    }
                    cur_node_index = stack.back();
                    stack.pop_back();
                    continue;
                }

                cur_node_index = cur_node.m_left;
                stack.push_back(cur_node.m_right);
            }
        }